

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler_unittest.cc
# Opt level: O1

void test_main_thread(void)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  uint uVar5;
  char local_c8 [8];
  char b [128];
  char *local_40;
  uint local_34;
  int result;
  
  local_34 = 0;
  iVar1 = *g_ticks_count;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mutex);
  if (iVar2 == 0) {
    if (*g_ticks_count < iVar1 + 0x1e) {
      do {
        if (0 < g_iters) {
          uVar3 = g_iters * 10;
          if ((int)uVar3 < 2) {
            uVar3 = 1;
          }
          uVar5 = 0;
          do {
            local_34 = local_34 ^ uVar5;
            uVar5 = uVar5 + 1;
          } while (uVar3 != uVar5);
        }
        snprintf(local_c8,0x80,"same: %d");
        local_40 = local_c8;
        (*noopt_helper)(&local_40);
      } while (*g_ticks_count < iVar1 + 0x1e);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&mutex);
    return;
  }
  uVar4 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)&mutex);
  _Unwind_Resume(uVar4);
}

Assistant:

static void test_main_thread() {
  int result = 0;
  char b[128];
  // Get at least 30 ticks
  int limit = *g_ticks_count + 30;

  std::lock_guard ml(mutex);

  while (*g_ticks_count < limit) {
    for (int i = 0; i < g_iters * 10; ++i ) {
      *const_cast<volatile int*>(&result) ^= i;
    }
    snprintf(b, sizeof(b), "same: %d", result);  // get some libc action
    (void)noopt(b); // 'consume' b
  }
}